

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O2

int64_t soul::TypeRules::checkAndGetArrayIndex<soul::CodeLocation&>
                  (CodeLocation *errorContext,Value *index)

{
  bool bVar1;
  int64_t iVar2;
  CompileMessage CStack_48;
  
  bVar1 = arraySizeTypeIsOK(&index->type);
  if (bVar1) {
    iVar2 = soul::Value::getAsInt64(index);
    return iVar2;
  }
  Errors::nonIntegerArrayIndex<>();
  CodeLocation::throwError(errorContext,&CStack_48);
}

Assistant:

static int64_t checkAndGetArrayIndex (Thrower&& errorContext, const Value& index)
    {
        if (! arraySizeTypeIsOK (index.getType()))
            errorContext.throwError (Errors::nonIntegerArrayIndex());

        return index.getAsInt64();
    }